

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
unicode_regex_split_stl
          (string *text,string *regex_expr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets)

{
  bool bVar1;
  reference puVar2;
  difference_type dVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cmatch match;
  int64_t start_idx;
  cregex_iterator end;
  cregex_iterator it;
  unsigned_long offset;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t start;
  regex expr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *bpe_offsets;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe78;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe80;
  unsigned_long *in_stack_fffffffffffffe88;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffea8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffec0;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *this;
  match_flag_type in_stack_fffffffffffffee4;
  regex_type *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff00;
  regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_c0;
  unsigned_long local_80;
  unsigned_long *local_78;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  long local_60;
  undefined1 local_41;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  
  local_20 = in_RCX;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            (in_stack_fffffffffffffec0,in_RDI,(flag_type)((ulong)in_RDI >> 0x20));
  local_41 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x55ca70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             in_stack_fffffffffffffea8);
  local_60 = 0;
  local_68 = local_20;
  local_70._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe78
                 );
  local_78 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffe78), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_70);
    local_80 = *puVar2;
    std::__cxx11::string::data();
    std::__cxx11::string::data();
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_iterator(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)0x55cb77
                  );
    in_stack_fffffffffffffef8 = (char *)0x0;
    while (bVar1 = std::__cxx11::
                   regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator!=
                             (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78), bVar1) {
      std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator*
                (&local_c0);
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
      match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)in_stack_fffffffffffffe80,
                    (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)in_stack_fffffffffffffe78);
      dVar3 = std::__cxx11::
              match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
              position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      if ((long)in_stack_fffffffffffffef8 < dVar3) {
        std::__cxx11::
        match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
        position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe90,(long *)in_stack_fffffffffffffe88);
      }
      in_stack_fffffffffffffe90 =
           (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
           std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           length((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      this = in_stack_fffffffffffffe90;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
                 (long *)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 =
           (unsigned_long *)
           std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           position((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe80 =
           (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
           std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           length((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffef8 =
           (char *)((long)in_stack_fffffffffffffe88 + (long)in_stack_fffffffffffffe80);
      std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++(this);
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
      ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      *)0x55cd1a);
    }
    if ((long)in_stack_fffffffffffffef8 < (long)local_80) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    }
    local_60 = local_80 + local_60;
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    0x55cd81);
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    0x55cd8e);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_70);
  }
  local_41 = 1;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffe80);
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

static std::vector<size_t> unicode_regex_split_stl(const std::string & text, const std::string & regex_expr, const std::vector<size_t> & offsets) {
    std::regex expr(regex_expr);
    std::vector<size_t> bpe_offsets; // store the offset of each word
    bpe_offsets.reserve(offsets.size()); // Reserve memory for the approximate size
    size_t start = 0;
    for (auto offset : offsets) {
        std::cregex_iterator it(text.data() + start, text.data() + start + offset, expr);
        std::cregex_iterator end;

        int64_t start_idx = 0;
        while (it != end) {
            std::cmatch match = *it;
            if (match.position() > start_idx) {
                bpe_offsets.emplace_back(match.position() - start_idx);
            }
            bpe_offsets.emplace_back(match.length());
            start_idx = match.position() + match.length();
            ++it;
        }

        if (start_idx < (int64_t) offset) {
            bpe_offsets.emplace_back(offset - start_idx);
        }
        start += offset;
    }

    return bpe_offsets;
}